

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_sizeof_matchState
                 (ZSTD_compressionParameters *cParams,ZSTD_useRowMatchFinderMode_e useRowMatchFinder
                 ,U32 enableDedicatedDictSearch,U32 forCCtx)

{
  ZSTD_strategy ZVar1;
  long lVar2;
  byte bVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  ZVar1 = cParams->strategy;
  if ((enableDedicatedDictSearch == 0 || forCCtx != 0) &&
     ((ZVar1 == ZSTD_fast ||
      (useRowMatchFinder == ZSTD_urm_enableRowMatchFinder && ZVar1 - ZSTD_greedy < 3)))) {
    lVar2 = 0;
  }
  else {
    lVar2 = 4L << ((byte)cParams->chainLog & 0x3f);
  }
  uVar5 = 0;
  if ((forCCtx != 0) && (uVar5 = 0, cParams->minMatch == 3)) {
    uVar5 = 0x11;
    if (cParams->windowLog < 0x11) {
      uVar5 = cParams->windowLog;
    }
  }
  bVar3 = (byte)cParams->hashLog;
  uVar8 = 0;
  uVar7 = (2L << (bVar3 & 0x3f)) + 0x3fU & 0xffffffffffffffc0;
  if (ZVar1 - ZSTD_btlazy2 < 0xfffffffd) {
    uVar7 = uVar8;
  }
  if (useRowMatchFinder != ZSTD_urm_enableRowMatchFinder) {
    uVar7 = uVar8;
  }
  uVar6 = 4L << ((byte)uVar5 & 0x3f);
  if (uVar5 == 0) {
    uVar6 = uVar8;
  }
  lVar4 = 0x24700;
  if (ZVar1 < ZSTD_btopt) {
    lVar4 = 0x40;
  }
  if (forCCtx == 0) {
    lVar4 = 0x40;
  }
  return lVar2 + (4L << (bVar3 & 0x3f)) + lVar4 + uVar6 + uVar7;
}

Assistant:

static size_t
ZSTD_sizeof_matchState(const ZSTD_compressionParameters* const cParams,
                       const ZSTD_useRowMatchFinderMode_e useRowMatchFinder,
                       const U32 enableDedicatedDictSearch,
                       const U32 forCCtx)
{
    /* chain table size should be 0 for fast or row-hash strategies */
    size_t const chainSize = ZSTD_allocateChainTable(cParams->strategy, useRowMatchFinder, enableDedicatedDictSearch && !forCCtx)
                                ? ((size_t)1 << cParams->chainLog)
                                : 0;
    size_t const hSize = ((size_t)1) << cParams->hashLog;
    U32    const hashLog3 = (forCCtx && cParams->minMatch==3) ? MIN(ZSTD_HASHLOG3_MAX, cParams->windowLog) : 0;
    size_t const h3Size = hashLog3 ? ((size_t)1) << hashLog3 : 0;
    /* We don't use ZSTD_cwksp_alloc_size() here because the tables aren't
     * surrounded by redzones in ASAN. */
    size_t const tableSpace = chainSize * sizeof(U32)
                            + hSize * sizeof(U32)
                            + h3Size * sizeof(U32);
    size_t const optPotentialSpace =
        ZSTD_cwksp_aligned_alloc_size((MaxML+1) * sizeof(U32))
      + ZSTD_cwksp_aligned_alloc_size((MaxLL+1) * sizeof(U32))
      + ZSTD_cwksp_aligned_alloc_size((MaxOff+1) * sizeof(U32))
      + ZSTD_cwksp_aligned_alloc_size((1<<Litbits) * sizeof(U32))
      + ZSTD_cwksp_aligned_alloc_size((ZSTD_OPT_NUM+1) * sizeof(ZSTD_match_t))
      + ZSTD_cwksp_aligned_alloc_size((ZSTD_OPT_NUM+1) * sizeof(ZSTD_optimal_t));
    size_t const lazyAdditionalSpace = ZSTD_rowMatchFinderUsed(cParams->strategy, useRowMatchFinder)
                                            ? ZSTD_cwksp_aligned_alloc_size(hSize*sizeof(U16))
                                            : 0;
    size_t const optSpace = (forCCtx && (cParams->strategy >= ZSTD_btopt))
                                ? optPotentialSpace
                                : 0;
    size_t const slackSpace = ZSTD_cwksp_slack_space_required();

    /* tables are guaranteed to be sized in multiples of 64 bytes (or 16 uint32_t) */
    ZSTD_STATIC_ASSERT(ZSTD_HASHLOG_MIN >= 4 && ZSTD_WINDOWLOG_MIN >= 4 && ZSTD_CHAINLOG_MIN >= 4);
    assert(useRowMatchFinder != ZSTD_urm_auto);

    DEBUGLOG(4, "chainSize: %u - hSize: %u - h3Size: %u",
                (U32)chainSize, (U32)hSize, (U32)h3Size);
    return tableSpace + optSpace + slackSpace + lazyAdditionalSpace;
}